

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_cleanup(archive_read *a)

{
  void *__ptr;
  ar *ar;
  archive_read *a_local;
  
  __ptr = a->format->data;
  if (*(long *)((long)__ptr + 0x20) != 0) {
    free(*(void **)((long)__ptr + 0x20));
  }
  free(__ptr);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_ar_cleanup(struct archive_read *a)
{
	struct ar *ar;

	ar = (struct ar *)(a->format->data);
	if (ar->strtab)
		free(ar->strtab);
	free(ar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}